

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O2

void text_sequence_list(t_text_sequence *x,t_symbol *s,int argc,t_atom *argv)

{
  uchar uVar1;
  t_atom *argv_00;
  int argc_00;
  
  x->x_loop = '\x01';
  uVar1 = '\x01';
  while (uVar1 != '\0') {
    argv_00 = argv;
    argc_00 = argc;
    if (argc == 0) {
      argv_00 = x->x_argv;
      argc_00 = x->x_argc;
    }
    text_sequence_doit(x,argc_00,argv_00);
    uVar1 = x->x_loop;
  }
  return;
}

Assistant:

static void text_sequence_list(t_text_sequence *x, t_symbol *s, int argc,
    t_atom *argv)
{
    x->x_loop = 1;
    while (x->x_loop)
    {
        if (argc)
            text_sequence_doit(x, argc, argv);
        else text_sequence_doit(x, x->x_argc, x->x_argv);
    }
}